

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<7,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  int i;
  Vector<float,_2> *pVVar6;
  float *pfVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  long lVar10;
  undefined4 *puVar11;
  undefined8 *puVar12;
  long lVar13;
  undefined1 *puVar14;
  bool bVar15;
  long lVar16;
  float *pfVar17;
  undefined8 *puVar18;
  float *pfVar19;
  bool bVar20;
  undefined8 *puVar21;
  float v_9;
  undefined4 uVar22;
  float fVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar26;
  float fVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float v;
  float fVar31;
  Matrix<float,_2,_2> res_1;
  Matrix<float,_2,_2> res_5;
  Type in0;
  undefined1 local_178 [12];
  float fStack_16c;
  float local_168 [2];
  undefined8 uStack_160;
  float local_158 [8];
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_118 [2];
  float fStack_110;
  float fStack_10c;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  ulong uStack_b0;
  float local_a8;
  float fStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  Matrix<float,_2,_2> retVal;
  Matrix<float,_2,_2> res_3;
  Matrix<float,_2,_2> res_2;
  Matrix<float,_2,_2> res;
  undefined8 uStack_40;
  undefined1 auVar27 [16];
  
  puVar9 = &local_f8;
  puVar8 = &local_f8;
  puVar18 = &local_f8;
  puVar12 = &local_f8;
  pVVar6 = retVal.m_data.m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar10 = 0;
    lVar13 = 0;
    do {
      lVar16 = 0;
      do {
        uVar22 = 0x3f800000;
        if (lVar10 != lVar16) {
          uVar22 = 0;
        }
        *(undefined4 *)((long)pVVar6->m_data + lVar16) = uVar22;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x40);
      lVar13 = lVar13 + 1;
      pVVar6 = (Vector<float,_2> *)(pVVar6->m_data + 1);
      lVar10 = lVar10 + 0x10;
    } while (lVar13 != 4);
    res_3.m_data.m_data[0].m_data = *(float (*) [2])(evalCtx->in[0].m_data + 2);
    retVal.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    res_3.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    res_2.m_data.m_data[0].m_data = *(float (*) [2])(evalCtx->in[1].m_data + 2);
    res_2.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    res.m_data.m_data[0].m_data = *(float (*) [2])(evalCtx->in[2].m_data + 2);
    res.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[3].m_data;
    uStack_40 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    res.m_data.m_data[1].m_data[0] = 0.0;
    res.m_data.m_data[1].m_data[1] = 0.0;
    uStack_40 = 0;
    res_2.m_data.m_data[1].m_data[0] = 0.0;
    res_2.m_data.m_data[1].m_data[1] = 0.0;
    res.m_data.m_data[0].m_data[0] = 0.0;
    res.m_data.m_data[0].m_data[1] = 0.0;
    res_3.m_data.m_data[1].m_data[0] = 0.0;
    res_3.m_data.m_data[1].m_data[1] = 0.0;
    res_2.m_data.m_data[0].m_data[0] = 0.0;
    res_2.m_data.m_data[0].m_data[1] = 0.0;
    retVal.m_data.m_data[1].m_data[0] = 0.0;
    retVal.m_data.m_data[1].m_data[1] = 0.0;
    res_3.m_data.m_data[0].m_data[0] = 0.0;
    res_3.m_data.m_data[0].m_data[1] = 0.0;
    puVar11 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar10 = 0;
    do {
      lVar13 = 0;
      do {
        pVVar6->m_data[lVar13] = *(float *)((long)puVar11 + lVar13);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x10);
      lVar10 = lVar10 + 1;
      pVVar6 = (Vector<float,_2> *)(pVVar6->m_data + 1);
      puVar11 = puVar11 + 4;
    } while (lVar10 != 4);
  }
  puVar1 = local_178 + 8;
  fVar31 = retVal.m_data.m_data[1].m_data[0] * res_3.m_data.m_data[1].m_data[1] +
           res_3.m_data.m_data[1].m_data[0] * -retVal.m_data.m_data[1].m_data[1];
  auVar29._4_4_ = -retVal.m_data.m_data[1].m_data[1];
  auVar29._0_4_ = res_3.m_data.m_data[1].m_data[1];
  auVar29._8_4_ = -res_3.m_data.m_data[1].m_data[0];
  auVar29._12_4_ = retVal.m_data.m_data[1].m_data[0];
  auVar24._4_4_ = fVar31;
  auVar24._0_4_ = fVar31;
  auVar24._8_4_ = fVar31;
  auVar24._12_4_ = fVar31;
  _local_178 = divps(auVar29,auVar24);
  local_118[0] = res_2.m_data.m_data[1].m_data[0];
  local_118[1] = res_2.m_data.m_data[1].m_data[1];
  fStack_110 = res.m_data.m_data[1].m_data[0];
  fStack_10c = res.m_data.m_data[1].m_data[1];
  local_128._0_4_ = res_3.m_data.m_data[0].m_data[0];
  local_128._4_4_ = res_3.m_data.m_data[0].m_data[1];
  fStack_120 = res_2.m_data.m_data[0].m_data[0];
  fStack_11c = res_2.m_data.m_data[0].m_data[1];
  local_158[4] = 1.0;
  local_158[5] = 0.0;
  local_158[6] = 0.0;
  local_158[7] = 1.0;
  pfVar7 = local_158 + 4;
  puVar21 = (undefined8 *)local_128;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    puVar14 = local_178;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + *(float *)(puVar21 + lVar13) * *(float *)(puVar14 + lVar13 * 4);
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      pfVar7[lVar10 * 2] = fVar31;
      lVar10 = 1;
      puVar14 = puVar1;
      bVar4 = false;
    } while (bVar5);
    pfVar7 = local_158 + 5;
    puVar21 = (undefined8 *)((long)local_128 + 4);
    bVar4 = false;
  } while (bVar15);
  local_f8 = 0x3f800000;
  uStack_f0 = 0x3f80000000000000;
  pfVar7 = local_158 + 4;
  puVar21 = &local_f8;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    pfVar17 = local_118;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + pfVar7[lVar13 * 2] * pfVar17[lVar13];
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      *(float *)((long)puVar21 + lVar10 * 8) = fVar31;
      lVar10 = 1;
      pfVar17 = &fStack_110;
      bVar4 = false;
    } while (bVar5);
    pfVar7 = local_158 + 5;
    puVar21 = (undefined8 *)((long)&local_f8 + 4);
    bVar4 = false;
  } while (bVar15);
  fVar31 = res.m_data.m_data[0].m_data[0] - (float)local_f8;
  fVar25 = res.m_data.m_data[0].m_data[1] - (float)((ulong)local_f8 >> 0x20);
  fVar26 = (float)uStack_40 - (float)uStack_f0;
  fVar30 = (float)((ulong)uStack_40 >> 0x20) - (float)((ulong)uStack_f0 >> 0x20);
  local_b8 = (undefined1  [8])CONCAT44(fVar25,fVar31);
  uStack_b0 = CONCAT44(fVar30,fVar26);
  auVar23._0_8_ = CONCAT44(fVar31,fVar25) ^ 0x80000000;
  auVar23._8_4_ = 0x80000000;
  auVar23._12_4_ = 0;
  fVar31 = fVar31 * fVar30 - fVar26 * fVar25;
  auVar28._4_8_ = 0;
  auVar28._0_4_ = fVar30;
  auVar28._12_4_ = 0x80000000;
  auVar27._8_8_ = auVar28._8_8_;
  auVar27._0_8_ = CONCAT44(fVar26,fVar30) ^ 0x8000000000000000;
  auVar2._4_4_ = fVar31;
  auVar2._0_4_ = fVar31;
  auVar2._8_4_ = fVar31;
  auVar2._12_4_ = fVar31;
  auVar29 = divps(auVar27,auVar2);
  auVar3._4_4_ = fVar31;
  auVar3._0_4_ = fVar31;
  auVar3._8_4_ = fVar31;
  auVar3._12_4_ = fVar31;
  auVar24 = divps(auVar23,auVar3);
  local_138 = CONCAT44(auVar24._0_4_,auVar29._0_4_);
  fStack_130 = auVar29._4_4_;
  fStack_12c = auVar24._4_4_;
  local_158[0] = 1.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 1.0;
  puVar14 = local_178;
  pfVar7 = local_158;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    pfVar17 = local_118;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + *(float *)(puVar14 + lVar13 * 8) * pfVar17[lVar13];
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      pfVar7[lVar10 * 2] = fVar31;
      lVar10 = 1;
      pfVar17 = &fStack_110;
      bVar4 = false;
    } while (bVar5);
    puVar14 = local_178 + 4;
    pfVar7 = local_158 + 1;
    bVar4 = false;
  } while (bVar15);
  local_168[0] = 1.0;
  local_168[1] = 0.0;
  uStack_160 = 0x3f80000000000000;
  pfVar7 = local_168;
  pfVar17 = local_158;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    pfVar19 = (float *)&local_138;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + pfVar17[lVar13 * 2] * pfVar19[lVar13];
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      pfVar7[lVar10 * 2] = fVar31;
      lVar10 = 1;
      pfVar19 = &fStack_130;
      bVar4 = false;
    } while (bVar5);
    pfVar7 = local_168 + 1;
    pfVar17 = local_158 + 1;
    bVar4 = false;
  } while (bVar15);
  local_f8 = 0x3f800000;
  uStack_f0 = 0x3f80000000000000;
  pfVar7 = local_168;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    pfVar17 = (float *)local_128;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + pfVar7[lVar13 * 2] * pfVar17[lVar13];
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      *(float *)((long)puVar9 + lVar10 * 8) = fVar31;
      lVar10 = 1;
      pfVar17 = &fStack_120;
      bVar4 = false;
    } while (bVar5);
    puVar9 = (undefined8 *)((long)&local_f8 + 4);
    pfVar7 = local_168 + 1;
    bVar4 = false;
  } while (bVar15);
  puVar9 = (undefined8 *)local_b8;
  local_b8 = (undefined1  [8])0x3f800000;
  uStack_b0 = 0x3f80000000000000;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    puVar14 = local_178;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + *(float *)((long)puVar8 + lVar13 * 8) * *(float *)(puVar14 + lVar13 * 4);
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      *(float *)(puVar9 + lVar10) = fVar31;
      lVar10 = 1;
      puVar14 = puVar1;
      bVar4 = false;
    } while (bVar5);
    puVar8 = (undefined8 *)((long)&local_f8 + 4);
    puVar9 = (undefined8 *)((long)local_b8 + 4);
    bVar4 = false;
  } while (bVar15);
  local_158[4] = local_b8._0_4_ + local_178._0_4_;
  local_158[5] = local_b8._4_4_ + local_178._4_4_;
  local_158[6] = (float)uStack_b0 + local_178._8_4_;
  local_158[7] = (float)(uStack_b0 >> 0x20) + fStack_16c;
  local_f8 = CONCAT44(0.0 - local_178._4_4_,0.0 - local_178._0_4_);
  uStack_f0 = CONCAT44(0.0 - fStack_16c,0.0 - local_178._8_4_);
  local_b8 = (undefined1  [8])0x3f800000;
  uStack_b0 = 0x3f80000000000000;
  puVar9 = (undefined8 *)local_b8;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    pfVar7 = local_118;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + *(float *)((long)puVar18 + lVar13 * 8) * pfVar7[lVar13];
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      *(float *)(puVar9 + lVar10) = fVar31;
      lVar10 = 1;
      pfVar7 = &fStack_110;
      bVar4 = false;
    } while (bVar5);
    puVar18 = (undefined8 *)((long)&local_f8 + 4);
    puVar9 = (undefined8 *)((long)local_b8 + 4);
    bVar4 = false;
  } while (bVar15);
  local_168[0] = 1.0;
  local_168[1] = 0.0;
  uStack_160 = 0x3f80000000000000;
  puVar9 = (undefined8 *)local_b8;
  pfVar7 = local_168;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    pfVar17 = (float *)&local_138;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + *(float *)(puVar9 + lVar13) * pfVar17[lVar13];
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      pfVar7[lVar10 * 2] = fVar31;
      lVar10 = 1;
      pfVar17 = &fStack_130;
      bVar4 = false;
    } while (bVar5);
    puVar9 = (undefined8 *)((long)local_b8 + 4);
    pfVar7 = local_168 + 1;
    bVar4 = false;
  } while (bVar15);
  local_f8 = CONCAT44(0.0 - auVar24._0_4_,0.0 - auVar29._0_4_);
  uStack_f0 = CONCAT44(0.0 - auVar24._4_4_,0.0 - auVar29._4_4_);
  local_b8 = (undefined1  [8])0x3f800000;
  uStack_b0 = 0x3f80000000000000;
  puVar9 = (undefined8 *)local_b8;
  puVar8 = &local_f8;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    pfVar7 = (float *)local_128;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + *(float *)((long)puVar8 + lVar13 * 8) * pfVar7[lVar13];
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      *(float *)(puVar9 + lVar10) = fVar31;
      lVar10 = 1;
      pfVar7 = &fStack_120;
      bVar4 = false;
    } while (bVar5);
    puVar9 = (undefined8 *)((long)local_b8 + 4);
    puVar8 = (undefined8 *)((long)&local_f8 + 4);
    bVar4 = false;
  } while (bVar15);
  local_158[0] = 1.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 1.0;
  puVar9 = (undefined8 *)local_b8;
  pfVar7 = local_158;
  bVar4 = true;
  do {
    bVar15 = bVar4;
    lVar10 = 0;
    puVar14 = local_178;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      fVar31 = 0.0;
      lVar13 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        fVar31 = fVar31 + *(float *)(puVar9 + lVar13) * *(float *)(puVar14 + lVar13 * 4);
        lVar13 = 1;
        bVar4 = false;
      } while (bVar20);
      pfVar7[lVar10 * 2] = fVar31;
      lVar10 = 1;
      puVar14 = puVar1;
      bVar4 = false;
    } while (bVar5);
    puVar9 = (undefined8 *)((long)local_b8 + 4);
    pfVar7 = local_158 + 1;
    bVar4 = false;
  } while (bVar15);
  puVar9 = (undefined8 *)local_b8;
  local_a8 = local_158[5];
  fStack_a4 = local_158[7];
  uStack_a0 = local_168[1];
  uStack_9c = uStack_160._4_4_;
  local_b8._4_4_ = local_158[6];
  local_b8._0_4_ = local_158[4];
  uStack_b0 = CONCAT44((undefined4)uStack_160,local_168[0]);
  local_98 = local_158[0];
  local_94 = local_158[2];
  local_90 = auVar29._0_8_;
  local_88 = local_158[1];
  local_84 = local_158[3];
  retVal.m_data.m_data[0].m_data[0] = SUB84(auVar24._0_8_,0);
  retVal.m_data.m_data[0].m_data[1] = SUB84(auVar24._0_8_,4);
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_e4 = 0;
  uStack_e0 = 0;
  fStack_dc = 0.0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  lVar10 = 0;
  do {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)puVar12 + lVar13 * 4) = *(undefined4 *)((long)puVar9 + lVar13);
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x10);
    lVar10 = lVar10 + 1;
    puVar12 = (undefined8 *)((long)puVar12 + 4);
    puVar9 = puVar9 + 2;
  } while (lVar10 != 4);
  local_118[0] = (float)(undefined4)local_f8;
  local_118[1] = (float)local_f8._4_4_;
  fStack_110 = (float)uStack_f0;
  local_128 = (undefined1  [8])CONCAT44(uStack_e0,uStack_e4);
  fStack_120 = fStack_dc;
  local_178 = ZEXT812(0);
  lVar10 = 0;
  do {
    *(float *)(local_178 + lVar10 * 4) =
         local_118[lVar10] + *(float *)((long)local_128 + lVar10 * 4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_138 = uStack_d0;
  fStack_130 = (float)local_d8;
  local_b8 = (undefined1  [8])0x0;
  uStack_b0 = uStack_b0 & 0xffffffff00000000;
  lVar10 = 0;
  do {
    *(float *)((long)local_b8 + lVar10 * 4) =
         *(float *)(local_178 + lVar10 * 4) + *(float *)((long)&local_138 + lVar10 * 4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_158[4] = (float)uStack_c0._4_4_;
  local_158[5] = (float)local_c8;
  local_158[6] = (float)((ulong)local_c8 >> 0x20);
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  uStack_160 = uStack_160 & 0xffffffff00000000;
  lVar10 = 0;
  do {
    local_168[lVar10] = *(float *)((long)local_b8 + lVar10 * 4) + local_158[lVar10 + 4];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  uStack_b0 = 0x100000000;
  local_a8 = 2.8026e-45;
  lVar10 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)local_b8 + lVar10 * 4)] =
         *(float *)(local_178 + lVar10 * 4 + 8);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(inverse(in0));
	}